

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_geom_buf.cxx
# Opt level: O1

void __thiscall xray_re::xr_vbuf::xr_vbuf(xr_vbuf *this,xr_vbuf *that)

{
  ulong uVar1;
  fvector3 *pfVar2;
  fvector2 *pfVar3;
  fcolor *__src;
  finfluence *__src_00;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  size_t sVar7;
  undefined7 uVar8;
  fvector3 *pfVar9;
  fvector2 *pfVar10;
  fcolor *__dest;
  finfluence *__dest_00;
  finfluence *pfVar11;
  ulong uVar12;
  long lVar13;
  
  (this->super_xr_flexbuf)._vptr_xr_flexbuf = (_func_int **)&PTR__xr_flexbuf_00248830;
  uVar8 = *(undefined7 *)&(that->super_xr_flexbuf).field_0x9;
  sVar7 = (that->super_xr_flexbuf).m_size;
  (this->super_xr_flexbuf).m_owner = (that->super_xr_flexbuf).m_owner;
  *(undefined7 *)&(this->super_xr_flexbuf).field_0x9 = uVar8;
  (this->super_xr_flexbuf).m_size = sVar7;
  (this->super_xr_flexbuf)._vptr_xr_flexbuf = (_func_int **)&PTR__xr_vbuf_00248788;
  (this->super_xr_flexbuf).m_owner = true;
  uVar1 = (that->super_xr_flexbuf).m_size;
  (this->super_xr_flexbuf).m_size = uVar1;
  pfVar2 = that->m_points;
  if (pfVar2 == (fvector3 *)0x0) {
    pfVar9 = (fvector3 *)0x0;
  }
  else {
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar1;
    uVar12 = 0xffffffffffffffff;
    if (SUB168(auVar4 * ZEXT816(0xc),8) == 0) {
      uVar12 = SUB168(auVar4 * ZEXT816(0xc),0);
    }
    pfVar9 = (fvector3 *)operator_new__(uVar12);
    if (uVar1 != 0) {
      memcpy(pfVar9,pfVar2,uVar1 * 0xc);
    }
  }
  this->m_points = pfVar9;
  pfVar2 = that->m_normals;
  if (pfVar2 == (fvector3 *)0x0) {
    pfVar9 = (fvector3 *)0x0;
  }
  else {
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar1;
    uVar12 = 0xffffffffffffffff;
    if (SUB168(auVar5 * ZEXT816(0xc),8) == 0) {
      uVar12 = SUB168(auVar5 * ZEXT816(0xc),0);
    }
    pfVar9 = (fvector3 *)operator_new__(uVar12);
    if (uVar1 != 0) {
      memcpy(pfVar9,pfVar2,uVar1 * 0xc);
    }
  }
  this->m_normals = pfVar9;
  pfVar3 = that->m_texcoords;
  if (pfVar3 == (fvector2 *)0x0) {
    pfVar10 = (fvector2 *)0x0;
  }
  else {
    uVar12 = 0xffffffffffffffff;
    if (uVar1 < 0x2000000000000000) {
      uVar12 = uVar1 * 8;
    }
    pfVar10 = (fvector2 *)operator_new__(uVar12);
    if (uVar1 != 0) {
      memcpy(pfVar10,pfVar3,uVar1 * 8);
    }
  }
  this->m_texcoords = pfVar10;
  pfVar3 = that->m_lightmaps;
  if (pfVar3 == (fvector2 *)0x0) {
    pfVar10 = (fvector2 *)0x0;
  }
  else {
    uVar12 = 0xffffffffffffffff;
    if (uVar1 < 0x2000000000000000) {
      uVar12 = uVar1 * 8;
    }
    pfVar10 = (fvector2 *)operator_new__(uVar12);
    if (uVar1 != 0) {
      memcpy(pfVar10,pfVar3,uVar1 * 8);
    }
  }
  this->m_lightmaps = pfVar10;
  __src = that->m_colors;
  if (__src == (fcolor *)0x0) {
    __dest = (fcolor *)0x0;
  }
  else {
    __dest = (fcolor *)operator_new__(-(ulong)(uVar1 >> 0x3c != 0) | uVar1 << 4);
    if (uVar1 != 0) {
      memcpy(__dest,__src,uVar1 << 4);
    }
  }
  this->m_colors = __dest;
  __src_00 = that->m_influences;
  if (__src_00 == (finfluence *)0x0) {
    __dest_00 = (finfluence *)0x0;
  }
  else {
    auVar6._8_8_ = 0;
    auVar6._0_8_ = uVar1;
    uVar12 = 0xffffffffffffffff;
    if (SUB168(auVar6 * ZEXT816(0x24),8) == 0) {
      uVar12 = SUB168(auVar6 * ZEXT816(0x24),0);
    }
    __dest_00 = (finfluence *)operator_new__(uVar12);
    if (uVar1 != 0) {
      pfVar11 = __dest_00;
      do {
        lVar13 = 4;
        do {
          *(undefined8 *)
           ((long)(pfVar11->super__svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>).array +
           lVar13 + -4) = 0x3f80000000000000;
          lVar13 = lVar13 + 8;
        } while (lVar13 != 0x24);
        (pfVar11->super__svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>).count = 0;
        pfVar11 = pfVar11 + 1;
      } while (pfVar11 != __dest_00 + uVar1);
      memcpy(__dest_00,__src_00,((uVar1 * 0x24 - 0x24) / 0x24) * 0x24 + 0x24);
    }
  }
  this->m_influences = __dest_00;
  make_signature(this);
  return;
}

Assistant:

xr_vbuf::xr_vbuf(const xr_vbuf& that): xr_flexbuf(that)
{
	set_owner(true);
	set_size(that.size());
	m_points = duplicate(that.m_points);
	m_normals = duplicate(that.m_normals);
	m_texcoords = duplicate(that.m_texcoords);
	m_lightmaps = duplicate(that.m_lightmaps);
	m_colors = duplicate(that.m_colors);
	m_influences = duplicate(that.m_influences);
	make_signature();
}